

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol.h
# Opt level: O2

void mp::internal::WriteSuffixes<mp::BasicSuffixSet<std::allocator<char>>>
               (BufferedFile *file,BasicSuffixSet<std::allocator<char>_> *suffixes)

{
  _Base_ptr p_Var1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  difference_type dVar2;
  size_t sVar3;
  _Base_ptr p_Var4;
  int tablen;
  SuffixValueCounter counter;
  char *name;
  Suffix local_48;
  SuffixValueWriter writer;
  int tabNlines;
  int num_values;
  
  if (suffixes != (BasicSuffixSet<std::allocator<char>_> *)0x0) {
    for (p_Var4 = (suffixes->set_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &(suffixes->set_)._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      if (((ulong)p_Var4[1]._M_left & 0x10) != 0) {
        counter.num_values_ = 0;
        name = (char *)(p_Var4 + 1);
        Suffix::VisitValues<mp::internal::SuffixValueCounter>((Suffix *)&name,&counter);
        num_values = counter.num_values_;
        name = *(char **)(p_Var4 + 1);
        p_Var1 = p_Var4[2]._M_parent;
        if (p_Var1 == (_Base_ptr)0x0) {
          tablen = 0;
          tabNlines = 0;
        }
        else {
          tablen = (int)p_Var1 + 1;
          __first._M_current = *(char **)(p_Var4 + 2);
          writer.file_._0_1_ = 10;
          dVar2 = std::
                  __count_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                            (__first,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      )(__first._M_current + (long)&p_Var1->_M_color),
                             (_Iter_equals_val<const_char>)&writer);
          tabNlines = (int)dVar2 + 1;
        }
        local_48.super_SuffixBase.impl_ =
             (SuffixBase)
             (CONCAT44(local_48.super_SuffixBase.impl_._4_4_,*(undefined4 *)&p_Var4[1]._M_left) &
             0xffffffff0000000f);
        sVar3 = strlen(name);
        writer.file_ = (BufferedFile *)(sVar3 + 1);
        fmt::BufferedFile::print<int,int,unsigned_long,int,int,char_const*>
                  (file,(CStringRef)0x1df60b,(int *)&local_48,&num_values,(unsigned_long *)&writer,
                   &tablen,&tabNlines,&name);
        if (tablen != 0) {
          fmt::BufferedFile::print<std::__cxx11::string>
                    (file,(CStringRef)0x1eebdd,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var4 + 2));
        }
        local_48.super_SuffixBase.impl_ = (SuffixBase)(Impl *)(p_Var4 + 1);
        writer.file_ = file;
        Suffix::VisitValues<mp::internal::SuffixValueWriter>(&local_48,&writer);
      }
    }
  }
  return;
}

Assistant:

void WriteSuffixes(fmt::BufferedFile &file, const SuffixMap *suffixes) {
  if (!suffixes)
    return;
  for (typename SuffixMap::iterator
       i = suffixes->begin(), e = suffixes->end(); i != e; ++i) {
    if ((i->kind() & suf::OUTPUT) == 0)
      continue;
    SuffixValueCounter counter;
    i->VisitValues(counter);
    int num_values = counter.num_values();
    const char *name = i->name();
    int mask = internal::SUFFIX_KIND_MASK | suf::FLOAT | suf::IODECL;
    const auto& table = i->table();
    int tablen = table.size() ? table.size()+1 : 0;
    int tabNlines = table.empty()? 0 :
                                   1+std::count(table.begin(), table.end(), '\n');
    file.print("suffix {} {} {} {} {}\n{}\n",
               i->kind() & mask, num_values, std::strlen(name) + 1,
               tablen, tabNlines, name);
    if (tablen)
      file.print("{}\n", table);
    SuffixValueWriter writer(file);
    i->VisitValues(writer);
  }
}